

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  uint32_t number;
  CppStringType CVar1;
  int iVar2;
  FieldDescriptor *field;
  double *pdVar3;
  uint *puVar4;
  float *pfVar5;
  bool *pbVar6;
  ArenaStringPtr *pAVar7;
  FieldDescriptor *field_00;
  Message *sub_message;
  int *piVar8;
  Cord **ppCVar9;
  LocalVarWrapper temp;
  TaggedStringPtr local_a8 [2];
  MessageWrapper local_98;
  uint32_t local_7c;
  MessageWrapper local_78;
  Cord *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  uint32_t local_38;
  CppType local_34;
  
  if ((oneof_descriptor->field_count_ == 1) && ((oneof_descriptor->fields_->field_0x1 & 2) != 0)) {
    SwapOneofField<true>();
    goto LAB_0027e28b;
  }
  number = GetOneofCase(this,lhs,oneof_descriptor);
  local_7c = GetOneofCase(this,rhs,oneof_descriptor);
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  local_38 = number;
  if (number == 0) {
    field = (FieldDescriptor *)0x0;
    goto LAB_0027dd43;
  }
  field = Descriptor::FindFieldByNumber(this->descriptor_,number);
  local_98.field = field;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    local_98.reflection = this;
    local_98.message = lhs;
    puVar4 = (uint *)GetRaw<int>(this,lhs,field);
    goto LAB_0027dca5;
  case 2:
    local_98.reflection = this;
    local_98.message = lhs;
    pAVar7 = (ArenaStringPtr *)GetRaw<long>(this,lhs,field);
    goto LAB_0027dd31;
  case 3:
    local_98.reflection = this;
    local_98.message = lhs;
    puVar4 = GetRaw<unsigned_int>(this,lhs,field);
    goto LAB_0027dca5;
  case 4:
    local_98.reflection = this;
    local_98.message = lhs;
    pAVar7 = (ArenaStringPtr *)GetRaw<unsigned_long>(this,lhs,field);
    goto LAB_0027dd31;
  case 5:
    local_98.reflection = this;
    local_98.message = lhs;
    pdVar3 = GetRaw<double>(this,lhs,field);
    local_60 = (Cord *)*pdVar3;
    break;
  case 6:
    local_98.reflection = this;
    local_98.message = lhs;
    pfVar5 = GetRaw<float>(this,lhs,field);
    local_60 = (Cord *)CONCAT44(local_60._4_4_,*pfVar5);
    break;
  case 7:
    local_98.reflection = this;
    local_98.message = lhs;
    pbVar6 = GetRaw<bool>(this,lhs,field);
    local_60 = (Cord *)CONCAT71(local_60._1_7_,*pbVar6);
    break;
  case 8:
    local_98.reflection = this;
    local_98.message = lhs;
    puVar4 = (uint *)GetRaw<int>(this,lhs,field);
LAB_0027dca5:
    local_60 = (Cord *)CONCAT44(local_60._4_4_,*puVar4);
    break;
  case 9:
    local_98.reflection = this;
    local_98.message = lhs;
    CVar1 = FieldDescriptor::cpp_string_type(field);
    if ((CVar1 == kView) || (CVar1 == kString)) {
      pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                         (local_98.reflection,local_98.message,local_98.field);
    }
    else {
      if (CVar1 != kCord) break;
      pAVar7 = (ArenaStringPtr *)
               GetRaw<absl::lts_20240722::Cord*>
                         (local_98.reflection,local_98.message,local_98.field);
    }
LAB_0027dd31:
    local_60 = (Cord *)(pAVar7->tagged_ptr_).ptr_;
    break;
  case 10:
    local_98.reflection = this;
    local_98.message = lhs;
    local_60 = (Cord *)UnsafeArenaReleaseMessage(this,lhs,field,(MessageFactory *)0x0);
    break;
  default:
    local_98.reflection = this;
    local_98.message = lhs;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x23c);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_a8,0x14,"unimplemented type: ");
    local_34 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
    absl::lts_20240722::log_internal::LogMessage::
    operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
              ((LogMessage *)local_a8,&local_34);
    goto LAB_0027e2d1;
  }
  SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_98);
LAB_0027dd43:
  if (local_7c != 0) {
    field_00 = Descriptor::FindFieldByNumber(this->descriptor_,local_7c);
    local_98.field = field_00;
    local_78.field = field_00;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_00->type_ * 4)) {
    case 1:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      piVar8 = GetRaw<int>(this,rhs,field_00);
      local_a8[0].ptr_._0_4_ = (float)*piVar8;
      SetField<int>(local_98.reflection,local_98.message,local_98.field,(int *)local_a8);
      break;
    case 2:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      pdVar3 = (double *)GetRaw<long>(this,rhs,field_00);
      local_a8[0].ptr_ = (void *)*pdVar3;
      SetField<long>(local_98.reflection,local_98.message,local_98.field,(long *)local_a8);
      break;
    case 3:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      puVar4 = GetRaw<unsigned_int>(this,rhs,field_00);
      local_a8[0].ptr_._0_4_ = (float)*puVar4;
      SetField<unsigned_int>(local_98.reflection,local_98.message,local_98.field,(uint *)local_a8);
      break;
    case 4:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      pdVar3 = (double *)GetRaw<unsigned_long>(this,rhs,field_00);
      local_a8[0].ptr_ = (void *)*pdVar3;
      SetField<unsigned_long>
                (local_98.reflection,local_98.message,local_98.field,(unsigned_long *)local_a8);
      break;
    case 5:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      pdVar3 = GetRaw<double>(this,rhs,field_00);
      local_a8[0].ptr_ = (void *)*pdVar3;
      SetField<double>(local_98.reflection,local_98.message,local_98.field,(double *)local_a8);
      break;
    case 6:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      pfVar5 = GetRaw<float>(this,rhs,field_00);
      local_a8[0].ptr_._0_4_ = *pfVar5;
      SetField<float>(local_98.reflection,local_98.message,local_98.field,(float *)local_a8);
      break;
    case 7:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      pbVar6 = GetRaw<bool>(this,rhs,field_00);
      local_a8[0].ptr_._0_1_ = *pbVar6;
      SetField<bool>(local_98.reflection,local_98.message,local_98.field,(bool *)local_a8);
      break;
    case 8:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      piVar8 = GetRaw<int>(this,rhs,field_00);
      local_a8[0].ptr_._0_4_ = (float)*piVar8;
      SetField<int>(local_98.reflection,local_98.message,local_98.field,(int *)local_a8);
      break;
    case 9:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      CVar1 = FieldDescriptor::cpp_string_type(field_00);
      if ((CVar1 == kView) || (CVar1 == kString)) {
        pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                           (local_78.reflection,local_78.message,local_78.field);
        local_a8[0].ptr_ = (pAVar7->tagged_ptr_).ptr_;
        SetField<google::protobuf::internal::ArenaStringPtr>
                  (local_98.reflection,local_98.message,local_98.field,(ArenaStringPtr *)local_a8);
      }
      else if (CVar1 == kCord) {
        ppCVar9 = GetRaw<absl::lts_20240722::Cord*>
                            (local_78.reflection,local_78.message,local_78.field);
        local_a8[0].ptr_ = *ppCVar9;
        SetField<absl::lts_20240722::Cord*>
                  (local_98.reflection,local_98.message,local_98.field,(Cord **)local_a8);
      }
      break;
    case 10:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      sub_message = UnsafeArenaReleaseMessage(this,rhs,field_00,(MessageFactory *)0x0);
      UnsafeArenaSetAllocatedMessage
                (local_98.reflection,local_98.message,sub_message,local_98.field);
      break;
    default:
      local_98.reflection = this;
      local_98.message = lhs;
      local_78.reflection = this;
      local_78.message = rhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (local_a8,0x14,"unimplemented type: ");
      local_34 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_00->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
                ((LogMessage *)local_a8,&local_34);
      goto LAB_0027e2d1;
    }
    SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_78);
  }
  if (local_38 != 0) {
    local_78.field = field;
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
      local_a8[0].ptr_._0_4_ = (float)local_60._0_4_;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<int>(this,rhs,field,(int *)local_a8);
      break;
    case 2:
      local_a8[0].ptr_ = local_60;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<long>(this,rhs,field,(long *)local_a8);
      break;
    case 3:
      local_a8[0].ptr_._0_4_ = (float)local_60._0_4_;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<unsigned_int>(this,rhs,field,(uint *)local_a8);
      break;
    case 4:
      local_a8[0].ptr_ = local_60;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<unsigned_long>(this,rhs,field,(unsigned_long *)local_a8);
      break;
    case 5:
      local_a8[0].ptr_ = local_60;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<double>(this,rhs,field,(double *)local_a8);
      break;
    case 6:
      local_a8[0].ptr_._0_4_ = (float)local_60._0_4_;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<float>(this,rhs,field,(float *)local_a8);
      break;
    case 7:
      local_a8[0].ptr_._0_1_ = local_60._0_1_;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<bool>(this,rhs,field,(bool *)local_a8);
      break;
    case 8:
      local_a8[0].ptr_._0_4_ = (float)local_60._0_4_;
      local_78.reflection = this;
      local_78.message = rhs;
      SetField<int>(this,rhs,field,(int *)local_a8);
      break;
    case 9:
      local_78.reflection = this;
      local_78.message = rhs;
      CVar1 = FieldDescriptor::cpp_string_type(field);
      if ((CVar1 == kView) || (CVar1 == kString)) {
        local_a8[0].ptr_ = local_60;
        SetField<google::protobuf::internal::ArenaStringPtr>
                  (local_78.reflection,local_78.message,local_78.field,(ArenaStringPtr *)local_a8);
      }
      else if (CVar1 == kCord) {
        local_a8[0].ptr_ = local_60;
        SetField<absl::lts_20240722::Cord*>
                  (local_78.reflection,local_78.message,local_78.field,(Cord **)local_a8);
      }
      break;
    case 10:
      local_78.reflection = this;
      local_78.message = rhs;
      UnsafeArenaSetAllocatedMessage(this,rhs,(Message *)local_60,field);
      break;
    default:
      local_78.reflection = this;
      local_78.message = rhs;
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x23c);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (local_a8,0x14,"unimplemented type: ");
      local_34 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
      absl::lts_20240722::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>
                ((LogMessage *)local_a8,&local_34);
      goto LAB_0027e2d1;
    }
  }
  if ((oneof_descriptor->field_count_ == 1) && ((oneof_descriptor->fields_->field_0x1 & 2) != 0)) {
LAB_0027e28b:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0xb32,0x21,"!oneof_descriptor->is_synthetic()");
  }
  else {
    iVar2 = (int)((ulong)((long)oneof_descriptor -
                         (long)oneof_descriptor->containing_type_->oneof_decls_) >> 3) * -0x24924924
    ;
    *(uint32_t *)
     ((long)&(lhs->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((this->schema_).oneof_case_offset_ + iVar2)) = local_7c;
    if ((oneof_descriptor->field_count_ != 1) || ((oneof_descriptor->fields_->field_0x1 & 2) == 0))
    {
      *(uint32_t *)
       ((long)&(rhs->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)(iVar2 + (this->schema_).oneof_case_offset_)) = local_38;
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
      return;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0xb32,0x21,"!oneof_descriptor->is_synthetic()");
  }
LAB_0027e2d1:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a8);
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    LOCAL_VAR_ACCESSOR(absl::Cord*, cord, Cord);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
      absl::Cord* type_cord;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    MESSAGE_FIELD_ACCESSOR(absl::Cord*, cord, Cord);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  ABSL_DCHECK(!oneof_descriptor->is_synthetic());
  uint32_t oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32_t oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}